

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O2

PVG_FT_Angle PVG_FT_Angle_Diff(PVG_FT_Angle angle1,PVG_FT_Angle angle2)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  lVar1 = -0xb3ffff;
  if (-0xb3ffff < angle2 - angle1) {
    lVar1 = angle2 - angle1;
  }
  uVar3 = (ulong)(lVar1 + angle1 != angle2);
  lVar2 = ((((lVar1 + angle1) - uVar3) - angle2) / 0x1680000 + uVar3) * 0x1680000 + angle2;
  lVar4 = lVar2 - angle1;
  lVar1 = 0xb40000;
  if (lVar4 < 0xb40000) {
    lVar1 = lVar4;
  }
  uVar3 = (lVar2 - (lVar1 + angle1)) + 0x167ffff;
  return lVar4 + (uVar3 % 0x1680000 - uVar3);
}

Assistant:

PVG_FT_Angle PVG_FT_Angle_Diff( PVG_FT_Angle  angle1, PVG_FT_Angle  angle2 )
{
    PVG_FT_Angle  delta = angle2 - angle1;

    while ( delta <= -PVG_FT_ANGLE_PI )
        delta += PVG_FT_ANGLE_2PI;

    while ( delta > PVG_FT_ANGLE_PI )
        delta -= PVG_FT_ANGLE_2PI;

    return delta;
}